

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O2

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
               (TSTNode<unsigned_char> *node,size_t depth)

{
  TSTNode<unsigned_char> *pTVar1;
  void *pvVar2;
  void *pvVar3;
  byte in_AL;
  long lVar4;
  size_t i;
  TSTNode<unsigned_char> *pTVar5;
  
  do {
    pTVar5 = node;
    pTVar1 = (TSTNode<unsigned_char> *)(pTVar5->buckets)._M_elems[0];
    if (((pTVar5->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
      if (pTVar1 != (TSTNode<unsigned_char> *)0x0) {
        pvVar2 = (pTVar1->buckets)._M_elems[1];
        pvVar3 = (pTVar1->buckets)._M_elems[0];
        lVar4 = 0;
        while ((long)pvVar2 - (long)pvVar3 >> 3 != lVar4) {
          in_AL = get_char<unsigned_char>
                            (*(uchar **)((long)(pTVar1->buckets)._M_elems[0] + lVar4 * 8),depth);
          lVar4 = lVar4 + 1;
          if (pTVar5->pivot <= in_AL) {
            __assert_fail("ch < node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xb7,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                         );
          }
        }
      }
    }
    else {
      in_AL = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                        (pTVar1,depth);
    }
    pTVar1 = (TSTNode<unsigned_char> *)(pTVar5->buckets)._M_elems[1];
    if (((pTVar5->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
      if (pTVar1 != (TSTNode<unsigned_char> *)0x0) {
        pvVar2 = (pTVar1->buckets)._M_elems[1];
        pvVar3 = (pTVar1->buckets)._M_elems[0];
        lVar4 = 0;
        while ((long)pvVar2 - (long)pvVar3 >> 3 != lVar4) {
          in_AL = get_char<unsigned_char>
                            (*(uchar **)((long)(pTVar1->buckets)._M_elems[0] + lVar4 * 8),depth);
          lVar4 = lVar4 + 1;
          if (in_AL != pTVar5->pivot) {
            __assert_fail("ch == node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xbd,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                         );
          }
        }
      }
    }
    else {
      in_AL = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                        (pTVar1,depth + 1);
    }
    node = (TSTNode<unsigned_char> *)(pTVar5->buckets)._M_elems[2];
    if (((pTVar5->is_tst).super__Base_bitset<1UL>._M_w & 4) == 0) {
      if (node != (TSTNode<unsigned_char> *)0x0) {
        pvVar2 = (node->buckets)._M_elems[1];
        pvVar3 = (node->buckets)._M_elems[0];
        lVar4 = 0;
        while ((long)pvVar2 - (long)pvVar3 >> 3 != lVar4) {
          in_AL = get_char<unsigned_char>
                            (*(uchar **)((long)(node->buckets)._M_elems[0] + lVar4 * 8),depth);
          lVar4 = lVar4 + 1;
          if (in_AL <= pTVar5->pivot) {
            __assert_fail("ch > node->pivot",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                          ,0xc3,
                          "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                         );
          }
        }
      }
      return (bool)in_AL;
    }
  } while( true );
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}